

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

void __thiscall Clasp::Asp::PrgDisj::detach(PrgDisj *this,LogicProgram *prg,bool full)

{
  undefined1 *puVar1;
  uint uVar2;
  PrgNode PVar3;
  pointer pPVar4;
  ulong uVar5;
  long lVar6;
  ebo local_40;
  
  PVar3 = (this->super_PrgHead).super_PrgNode;
  uVar2 = *(uint *)&(this->super_PrgHead).field_0x18;
  for (uVar5 = 0; (uVar2 & 0x7ffffff) << 2 != uVar5; uVar5 = uVar5 + 4) {
    PrgHead::removeSupport
              (&(prg->atoms_).ebo_.buf[*(uint *)(&(this->super_PrgHead).field_0x1c + uVar5)]->
                super_PrgHead,
               (PrgEdge)(((uint)((ulong)PVar3 >> 0x1c) & 0xfffffff0) + ((int)~uVar2 >> 0x1f) * -8 +
                        2));
  }
  pPVar4 = (this->super_PrgHead).supports_.ebo_.buf;
  (this->super_PrgHead).supports_.ebo_.buf = (pointer)0x0;
  local_40.size = (this->super_PrgHead).supports_.ebo_.size;
  local_40.cap = (this->super_PrgHead).supports_.ebo_.cap;
  (this->super_PrgHead).supports_.ebo_.size = 0;
  (this->super_PrgHead).supports_.ebo_.cap = 0;
  uVar5 = local_40._8_8_ & 0xffffffff;
  local_40.buf = pPVar4;
  for (lVar6 = 0; uVar5 << 2 != lVar6; lVar6 = lVar6 + 4) {
    PrgBody::removeHead((prg->bodies_).ebo_.buf[*(uint *)((long)&pPVar4->rep + lVar6) >> 4],
                        &this->super_PrgHead,Normal);
  }
  if (full) {
    (this->super_PrgHead).supports_.ebo_.size = 0;
    puVar1 = &(this->super_PrgHead).field_0x1b;
    *puVar1 = *puVar1 & 0xe7;
    PrgNode::markRemoved((PrgNode *)this);
  }
  else {
    pPVar4 = (this->super_PrgHead).supports_.ebo_.buf;
    (this->super_PrgHead).supports_.ebo_.buf = local_40.buf;
    uVar5._0_4_ = (this->super_PrgHead).supports_.ebo_.size;
    uVar5._4_4_ = (this->super_PrgHead).supports_.ebo_.cap;
    (this->super_PrgHead).supports_.ebo_.size = local_40.size;
    (this->super_PrgHead).supports_.ebo_.cap = local_40.cap;
    local_40.buf = pPVar4;
    local_40._8_8_ = uVar5;
  }
  bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::ebo::~ebo
            (&local_40);
  return;
}

Assistant:

void PrgDisj::detach(LogicProgram& prg, bool full) {
	PrgEdge edge = PrgEdge::newEdge(*this, PrgEdge::Choice);
	for (atom_iterator it = begin(), end = this->end(); it != end; ++it) {
		prg.getAtom(*it)->removeSupport(edge);
	}
	EdgeVec temp; temp.swap(supports_);
	for (PrgDisj::sup_iterator it = temp.begin(), end = temp.end(); it != end; ++it) {
		prg.getBody(it->node())->removeHead(this, PrgEdge::Normal);
	}
	if (full) {
		clearSupports();
		markRemoved();
	}
	else {
		supports_.swap(temp);
	}
}